

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::deinit(TextureViewTestBaseAndMaxLevels *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_layer_data_lod0 != (uchar *)0x0) {
    operator_delete__(this->m_layer_data_lod0);
    this->m_layer_data_lod0 = (uchar *)0x0;
  }
  if (this->m_layer_data_lod1 != (uchar *)0x0) {
    operator_delete__(this->m_layer_data_lod1);
    this->m_layer_data_lod1 = (uchar *)0x0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_result_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_result_to_id);
    this->m_result_to_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_view_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_view_to_id);
    this->m_view_to_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void TextureViewTestBaseAndMaxLevels::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_layer_data_lod0 != DE_NULL)
	{
		delete[] m_layer_data_lod0;

		m_layer_data_lod0 = DE_NULL;
	}

	if (m_layer_data_lod1 != DE_NULL)
	{
		delete[] m_layer_data_lod1;

		m_layer_data_lod1 = DE_NULL;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_result_to_id != 0)
	{
		gl.deleteTextures(1, &m_result_to_id);

		m_result_to_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_view_to_id != 0)
	{
		gl.deleteTextures(1, &m_view_to_id);

		m_view_to_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}